

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall agge::tests::LayoutTests::LongSingleLineIsBrokenOnWordBounds(LayoutTests *this)

{
  wrap limiter;
  wrap limiter_00;
  element_type *peVar1;
  glyph *local_f48;
  allocator local_ee9;
  string local_ee8;
  LocationInfo local_ec8;
  text_line *local_ea0;
  text_line *local_e98;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_e90;
  int local_e74 [11];
  vector<int,_std::allocator<int>_> local_e48;
  vector<int,_std::allocator<int>_> local_e30;
  vector<int,_std::allocator<int>_> local_e18;
  vector<int,_std::allocator<int>_> local_e00;
  vector<int,_std::allocator<int>_> local_de8;
  vector<int,_std::allocator<int>_> local_dd0;
  vector<int,_std::allocator<int>_> local_db8;
  vector<int,_std::allocator<int>_> local_da0;
  vector<int,_std::allocator<int>_> local_d88;
  vector<int,_std::allocator<int>_> local_d70;
  vector<int,_std::allocator<int>_> local_d58;
  undefined1 local_d40 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_cf8;
  ref_text_line local_ce0;
  int local_cb4 [9];
  vector<int,_std::allocator<int>_> local_c90;
  vector<int,_std::allocator<int>_> local_c78;
  vector<int,_std::allocator<int>_> local_c60;
  vector<int,_std::allocator<int>_> local_c48;
  vector<int,_std::allocator<int>_> local_c30;
  vector<int,_std::allocator<int>_> local_c18;
  vector<int,_std::allocator<int>_> local_c00;
  vector<int,_std::allocator<int>_> local_be8;
  vector<int,_std::allocator<int>_> local_bd0;
  undefined1 local_bb8 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_b70;
  ref_text_line local_b58;
  int local_b30 [10];
  vector<int,_std::allocator<int>_> local_b08;
  vector<int,_std::allocator<int>_> local_af0;
  vector<int,_std::allocator<int>_> local_ad8;
  vector<int,_std::allocator<int>_> local_ac0;
  vector<int,_std::allocator<int>_> local_aa8;
  vector<int,_std::allocator<int>_> local_a90;
  vector<int,_std::allocator<int>_> local_a78;
  vector<int,_std::allocator<int>_> local_a60;
  vector<int,_std::allocator<int>_> local_a48;
  vector<int,_std::allocator<int>_> local_a30;
  undefined1 local_a18 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_9d0;
  ref_text_line local_9b8;
  int local_990 [12];
  vector<int,_std::allocator<int>_> local_960;
  vector<int,_std::allocator<int>_> local_948;
  vector<int,_std::allocator<int>_> local_930;
  vector<int,_std::allocator<int>_> local_918;
  vector<int,_std::allocator<int>_> local_900;
  vector<int,_std::allocator<int>_> local_8e8;
  vector<int,_std::allocator<int>_> local_8d0;
  vector<int,_std::allocator<int>_> local_8b8;
  vector<int,_std::allocator<int>_> local_8a0;
  vector<int,_std::allocator<int>_> local_888;
  vector<int,_std::allocator<int>_> local_870;
  vector<int,_std::allocator<int>_> local_858;
  undefined1 local_840 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_7f8;
  ref_text_line local_7e0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_7b8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_7a0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_788;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_770;
  allocator local_751;
  string local_750;
  LocationInfo local_730;
  text_line *local_708;
  text_line *local_700;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_6f8;
  int local_6dc [9];
  vector<int,_std::allocator<int>_> local_6b8;
  vector<int,_std::allocator<int>_> local_6a0;
  vector<int,_std::allocator<int>_> local_688;
  vector<int,_std::allocator<int>_> local_670;
  vector<int,_std::allocator<int>_> local_658;
  vector<int,_std::allocator<int>_> local_640;
  vector<int,_std::allocator<int>_> local_628;
  vector<int,_std::allocator<int>_> local_610;
  vector<int,_std::allocator<int>_> local_5f8;
  undefined1 local_5e0 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_598;
  ref_text_line local_580;
  int local_558 [12];
  vector<int,_std::allocator<int>_> local_528;
  vector<int,_std::allocator<int>_> local_510;
  vector<int,_std::allocator<int>_> local_4f8;
  vector<int,_std::allocator<int>_> local_4e0;
  vector<int,_std::allocator<int>_> local_4c8;
  vector<int,_std::allocator<int>_> local_4b0;
  vector<int,_std::allocator<int>_> local_498;
  vector<int,_std::allocator<int>_> local_480;
  vector<int,_std::allocator<int>_> local_468;
  vector<int,_std::allocator<int>_> local_450;
  vector<int,_std::allocator<int>_> local_438;
  vector<int,_std::allocator<int>_> local_420;
  undefined1 local_408 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3c0;
  ref_text_line local_3a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_380;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_368;
  wrap local_350;
  allocator local_331;
  string local_330;
  richtext_t local_310;
  wrap local_2a8;
  allocator local_289;
  string local_288;
  richtext_t local_268;
  undefined1 local_200 [8];
  layout l2;
  layout l1;
  const_iterator gr;
  undefined1 local_148 [8];
  factory_ptr f;
  glyph glyphs [6];
  char_to_index indices [6];
  LayoutTests *this_local;
  
  glyphs[5].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c666666666666;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4028000000000000;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  glyphs[3].metrics.dx = 0.0;
  glyphs[3].metrics.dy = 0.0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[3].metrics.dy);
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  glyphs[4].metrics.dx = 0.0;
  glyphs[4].metrics.dy = 0.0;
  glyphs[4].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[4].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[4].metrics.dy);
  glyphs[4].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  glyphs[5].metrics.dx = 0.0;
  glyphs[5].metrics.dy = 0.0;
  glyphs[5].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[5].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[5].metrics.dy);
  create_single_font_factory<6ul,6ul>
            ((LayoutTests *)local_148,(font_metrics *)this,
             (char_to_index (*) [6])(anonymous_namespace)::c_fm1,
             (glyph (*) [6])
             &glyphs[5].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  ::__normal_iterator((__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                       *)&l1._box);
  layout::layout((layout *)&l2._box);
  layout::layout((layout *)local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"AAAA BBBB CC BBBB AAAA",&local_289);
  R(&local_268,&local_288);
  limit::wrap::wrap(&local_2a8,139.1);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_148);
  limiter._eow.next = local_2a8._eow.next;
  limiter._sow.extent = local_2a8._sow.extent;
  limiter._limit = local_2a8._limit;
  limiter._eow.extent = local_2a8._eow.extent;
  limiter._sow.next = local_2a8._sow.next;
  limiter._previous_space = local_2a8._previous_space;
  limiter._21_3_ = local_2a8._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)&l2._box,&local_268,limiter,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_330,"CCC\'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB.",&local_331);
  R(&local_310,&local_330);
  limit::wrap::wrap(&local_350,139.1);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_148);
  limiter_00._eow.next = local_350._eow.next;
  limiter_00._sow.extent = local_350._sow.extent;
  limiter_00._limit = local_350._limit;
  limiter_00._eow.extent = local_350._eow.extent;
  limiter_00._sow.next = local_350._sow.next;
  limiter_00._previous_space = local_350._previous_space;
  limiter_00._21_3_ = local_350._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)local_200,&local_310,limiter_00,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_408);
  local_558[0xb] = 1;
  plural_::operator+(&local_528,(plural_ *)&plural,local_558 + 0xb);
  local_558[10] = 1;
  tests::operator+(&local_510,&local_528,local_558 + 10);
  local_558[9] = 1;
  tests::operator+(&local_4f8,&local_510,local_558 + 9);
  local_558[8] = 1;
  tests::operator+(&local_4e0,&local_4f8,local_558 + 8);
  local_558[7] = 0;
  tests::operator+(&local_4c8,&local_4e0,local_558 + 7);
  local_558[6] = 2;
  tests::operator+(&local_4b0,&local_4c8,local_558 + 6);
  local_558[5] = 2;
  tests::operator+(&local_498,&local_4b0,local_558 + 5);
  local_558[4] = 2;
  tests::operator+(&local_480,&local_498,local_558 + 4);
  local_558[3] = 2;
  tests::operator+(&local_468,&local_480,local_558 + 3);
  local_558[2] = 0;
  tests::operator+(&local_450,&local_468,local_558 + 2);
  local_558[1] = 3;
  tests::operator+(&local_438,&local_450,local_558 + 1);
  local_558[0] = 3;
  tests::operator+(&local_420,&local_438,local_558);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_408 + 0x10),(shared_ptr<agge::font> *)local_408,0.0,0.0,
             &local_420);
  plural_::operator+(&local_3c0,(plural_ *)&plural,(ref_glyph_run *)(local_408 + 0x10));
  ref_text_line::ref_text_line(&local_3a8,0.0,10.0,132.2,&local_3c0);
  plural_::operator+(&local_380,(plural_ *)&plural,&local_3a8);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_5e0);
  local_6dc[8] = 2;
  plural_::operator+(&local_6b8,(plural_ *)&plural,local_6dc + 8);
  local_6dc[7] = 2;
  tests::operator+(&local_6a0,&local_6b8,local_6dc + 7);
  local_6dc[6] = 2;
  tests::operator+(&local_688,&local_6a0,local_6dc + 6);
  local_6dc[5] = 2;
  tests::operator+(&local_670,&local_688,local_6dc + 5);
  local_6dc[4] = 0;
  tests::operator+(&local_658,&local_670,local_6dc + 4);
  local_6dc[3] = 1;
  tests::operator+(&local_640,&local_658,local_6dc + 3);
  local_6dc[2] = 1;
  tests::operator+(&local_628,&local_640,local_6dc + 2);
  local_6dc[1] = 1;
  tests::operator+(&local_610,&local_628,local_6dc + 1);
  local_6dc[0] = 1;
  tests::operator+(&local_5f8,&local_610,local_6dc);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_5e0 + 0x10),(shared_ptr<agge::font> *)local_5e0,0.0,0.0,
             &local_5f8);
  plural_::operator+(&local_598,(plural_ *)&plural,(ref_glyph_run *)(local_5e0 + 0x10));
  ref_text_line::ref_text_line(&local_580,0.0,24.0,99.1,&local_598);
  tests::operator+(&local_368,&local_380,&local_580);
  local_700 = (text_line *)layout::begin((layout *)&l2._box);
  local_708 = (text_line *)layout::end((layout *)&l2._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_6f8,(tests *)local_700,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_708,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_350._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_750,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_751);
  ut::LocationInfo::LocationInfo(&local_730,&local_750,0x17f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_368,&local_6f8,&local_730);
  ut::LocationInfo::~LocationInfo(&local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_6f8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_368);
  ref_text_line::~ref_text_line(&local_580);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_598);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_5e0 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_5f8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_610);
  std::vector<int,_std::allocator<int>_>::~vector(&local_628);
  std::vector<int,_std::allocator<int>_>::~vector(&local_640);
  std::vector<int,_std::allocator<int>_>::~vector(&local_658);
  std::vector<int,_std::allocator<int>_>::~vector(&local_670);
  std::vector<int,_std::allocator<int>_>::~vector(&local_688);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6b8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_5e0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_380);
  ref_text_line::~ref_text_line(&local_3a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_408 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_420);
  std::vector<int,_std::allocator<int>_>::~vector(&local_438);
  std::vector<int,_std::allocator<int>_>::~vector(&local_450);
  std::vector<int,_std::allocator<int>_>::~vector(&local_468);
  std::vector<int,_std::allocator<int>_>::~vector(&local_480);
  std::vector<int,_std::allocator<int>_>::~vector(&local_498);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4b0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4e0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4f8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_510);
  std::vector<int,_std::allocator<int>_>::~vector(&local_528);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_408);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_840);
  local_990[0xb] = 3;
  plural_::operator+(&local_960,(plural_ *)&plural,local_990 + 0xb);
  local_990[10] = 3;
  tests::operator+(&local_948,&local_960,local_990 + 10);
  local_990[9] = 3;
  tests::operator+(&local_930,&local_948,local_990 + 9);
  local_990[8] = 4;
  tests::operator+(&local_918,&local_930,local_990 + 8);
  local_990[7] = 3;
  tests::operator+(&local_900,&local_918,local_990 + 7);
  local_990[6] = 0;
  tests::operator+(&local_8e8,&local_900,local_990 + 6);
  local_990[5] = 2;
  tests::operator+(&local_8d0,&local_8e8,local_990 + 5);
  local_990[4] = 2;
  tests::operator+(&local_8b8,&local_8d0,local_990 + 4);
  local_990[3] = 2;
  tests::operator+(&local_8a0,&local_8b8,local_990 + 3);
  local_990[2] = 0;
  tests::operator+(&local_888,&local_8a0,local_990 + 2);
  local_990[1] = 1;
  tests::operator+(&local_870,&local_888,local_990 + 1);
  local_990[0] = 1;
  tests::operator+(&local_858,&local_870,local_990);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_840 + 0x10),(shared_ptr<agge::font> *)local_840,0.0,0.0,
             &local_858);
  plural_::operator+(&local_7f8,(plural_ *)&plural,(ref_glyph_run *)(local_840 + 0x10));
  ref_text_line::ref_text_line(&local_7e0,0.0,10.0,127.2,&local_7f8);
  plural_::operator+(&local_7b8,(plural_ *)&plural,&local_7e0);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_a18);
  local_b30[9] = 1;
  plural_::operator+(&local_b08,(plural_ *)&plural,local_b30 + 9);
  local_b30[8] = 1;
  tests::operator+(&local_af0,&local_b08,local_b30 + 8);
  local_b30[7] = 0;
  tests::operator+(&local_ad8,&local_af0,local_b30 + 7);
  local_b30[6] = 1;
  tests::operator+(&local_ac0,&local_ad8,local_b30 + 6);
  local_b30[5] = 1;
  tests::operator+(&local_aa8,&local_ac0,local_b30 + 5);
  local_b30[4] = 1;
  tests::operator+(&local_a90,&local_aa8,local_b30 + 4);
  local_b30[3] = 1;
  tests::operator+(&local_a78,&local_a90,local_b30 + 3);
  local_b30[2] = 2;
  tests::operator+(&local_a60,&local_a78,local_b30 + 2);
  local_b30[1] = 2;
  tests::operator+(&local_a48,&local_a60,local_b30 + 1);
  local_b30[0] = 2;
  tests::operator+(&local_a30,&local_a48,local_b30);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_a18 + 0x10),(shared_ptr<agge::font> *)local_a18,0.0,0.0,
             &local_a30);
  plural_::operator+(&local_9d0,(plural_ *)&plural,(ref_glyph_run *)(local_a18 + 0x10));
  ref_text_line::ref_text_line(&local_9b8,0.0,24.0,109.1,&local_9d0);
  tests::operator+(&local_7a0,&local_7b8,&local_9b8);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_bb8);
  local_cb4[8] = 3;
  plural_::operator+(&local_c90,(plural_ *)&plural,local_cb4 + 8);
  local_cb4[7] = 3;
  tests::operator+(&local_c78,&local_c90,local_cb4 + 7);
  local_cb4[6] = 3;
  tests::operator+(&local_c60,&local_c78,local_cb4 + 6);
  local_cb4[5] = 3;
  tests::operator+(&local_c48,&local_c60,local_cb4 + 5);
  local_cb4[4] = 0;
  tests::operator+(&local_c30,&local_c48,local_cb4 + 4);
  local_cb4[3] = 1;
  tests::operator+(&local_c18,&local_c30,local_cb4 + 3);
  local_cb4[2] = 1;
  tests::operator+(&local_c00,&local_c18,local_cb4 + 2);
  local_cb4[1] = 1;
  tests::operator+(&local_be8,&local_c00,local_cb4 + 1);
  local_cb4[0] = 1;
  tests::operator+(&local_bd0,&local_be8,local_cb4);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_bb8 + 0x10),(shared_ptr<agge::font> *)local_bb8,0.0,0.0,
             &local_bd0);
  plural_::operator+(&local_b70,(plural_ *)&plural,(ref_glyph_run *)(local_bb8 + 0x10));
  ref_text_line::ref_text_line(&local_b58,0.0,38.0,103.1,&local_b70);
  tests::operator+(&local_788,&local_7a0,&local_b58);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_148);
  font_factory::operator*((font_factory *)local_d40);
  local_e74[10] = 1;
  plural_::operator+(&local_e48,(plural_ *)&plural,local_e74 + 10);
  local_e74[9] = 2;
  tests::operator+(&local_e30,&local_e48,local_e74 + 9);
  local_e74[8] = 1;
  tests::operator+(&local_e18,&local_e30,local_e74 + 8);
  local_e74[7] = 2;
  tests::operator+(&local_e00,&local_e18,local_e74 + 7);
  local_e74[6] = 1;
  tests::operator+(&local_de8,&local_e00,local_e74 + 6);
  local_e74[5] = 2;
  tests::operator+(&local_dd0,&local_de8,local_e74 + 5);
  local_e74[4] = 1;
  tests::operator+(&local_db8,&local_dd0,local_e74 + 4);
  local_e74[3] = 2;
  tests::operator+(&local_da0,&local_db8,local_e74 + 3);
  local_e74[2] = 1;
  tests::operator+(&local_d88,&local_da0,local_e74 + 2);
  local_e74[1] = 2;
  tests::operator+(&local_d70,&local_d88,local_e74 + 1);
  local_e74[0] = 5;
  tests::operator+(&local_d58,&local_d70,local_e74);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_d40 + 0x10),(shared_ptr<agge::font> *)local_d40,0.0,0.0,
             &local_d58);
  plural_::operator+(&local_cf8,(plural_ *)&plural,(ref_glyph_run *)(local_d40 + 0x10));
  ref_text_line::ref_text_line(&local_ce0,0.0,52.0,118.0,&local_cf8);
  tests::operator+(&local_770,&local_788,&local_ce0);
  local_e98 = (text_line *)layout::begin((layout *)local_200);
  local_ea0 = (text_line *)layout::end((layout *)local_200);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_e90,(tests *)local_e98,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_ea0,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_350._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ee8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_ee9);
  ut::LocationInfo::LocationInfo(&local_ec8,&local_ee8,0x186);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_770,&local_e90,&local_ec8);
  ut::LocationInfo::~LocationInfo(&local_ec8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_e90);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_770);
  ref_text_line::~ref_text_line(&local_ce0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_cf8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_d40 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_d58);
  std::vector<int,_std::allocator<int>_>::~vector(&local_d70);
  std::vector<int,_std::allocator<int>_>::~vector(&local_d88);
  std::vector<int,_std::allocator<int>_>::~vector(&local_da0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_db8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_dd0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_de8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e00);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e18);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e48);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_d40);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_788);
  ref_text_line::~ref_text_line(&local_b58);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_b70);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_bb8 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_bd0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_be8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c00);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c18);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c48);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c60);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c78);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c90);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_bb8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_7a0);
  ref_text_line::~ref_text_line(&local_9b8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_9d0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_a18 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_a30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a48);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a60);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a78);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_aa8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_ac0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_ad8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_af0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b08);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_a18);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_7b8);
  ref_text_line::~ref_text_line(&local_7e0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_7f8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_840 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_858);
  std::vector<int,_std::allocator<int>_>::~vector(&local_870);
  std::vector<int,_std::allocator<int>_>::~vector(&local_888);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8d0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_900);
  std::vector<int,_std::allocator<int>_>::~vector(&local_918);
  std::vector<int,_std::allocator<int>_>::~vector(&local_930);
  std::vector<int,_std::allocator<int>_>::~vector(&local_948);
  std::vector<int,_std::allocator<int>_>::~vector(&local_960);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_840);
  layout::~layout((layout *)local_200);
  layout::~layout((layout *)&l2._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_148);
  local_f48 = (glyph *)&glyphs[5].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_f48 = local_f48 + -1;
    mocks::font_accessor::glyph::~glyph(local_f48);
  } while (local_f48 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( LongSingleLineIsBrokenOnWordBounds )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = {
					{ L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, { L'\'', 4 }, { L'.', 5 },
				};
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 12, 0 } },
					{ { 13, 0 } },
					{ { 3, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;

				layout l1;
				layout l2;

				// ACT
				// 44 + 7.1 + 48 + 7.1 + 26 + 7.1 + 48 + 7.1 + 44
				// AAAA BBBB CC|BBBB AAAA
				l1.process (R("AAAA BBBB CC BBBB AAAA"), limit::wrap(139.1f), *f);

				// 55 + 7.1 + 36 + 7.1 + 22 + 7.1 + 22 + 7.1 + 80 + 7.1 + 52 + 7.1 + 44 + 7.1 + 118
				// CCC'C BBB AA|AA AAAABBB|CCCC AAAA|ABABABABAB.
				l2.process(R("CCC'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB."), limit::wrap(139.1f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 132.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 0 + 2 + 2 + 2 + 2 + 0 + 3 + 3))
					+ ref_text_line(0.0f, 24.0f, 99.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2 + 2 + 2 + 2 + 0 + 1 + 1 + 1 + 1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 127.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 + 4 + 3 + 0 + 2 + 2 + 2 + 0 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 109.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 0 + 1 + 1 + 1 + 1 + 2 + 2 + 2))
					+ ref_text_line(0.0f, 38.0f, 103.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 +3 + 0 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 52.0f, 118.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 5)),
					mkvector(l2.begin(), l2.end()));
			}